

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_file_sink-inl.h
# Opt level: O0

void __thiscall
spdlog::sinks::basic_file_sink<spdlog::details::null_mutex>::sink_it_
          (basic_file_sink<spdlog::details::null_mutex> *this,log_msg *msg)

{
  pointer pfVar1;
  size_t in_RCX;
  void *__buf;
  undefined8 in_RSI;
  allocator<char> *in_RDI;
  memory_buf_t formatted;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *this_00;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> local_131;
  undefined8 local_10;
  
  this_00 = &local_131;
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  fmt::v10::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::basic_memory_buffer
            (this_00,in_RDI);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  pfVar1 = std::unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_>::operator->
                     ((unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *)
                      0x30d37a);
  (*pfVar1->_vptr_formatter[2])
            (pfVar1,local_10,(undefined1 *)((long)&local_131.super_buffer<char>._vptr_buffer + 1));
  details::file_helper::write((file_helper *)(in_RDI + 0x20),(int)&local_131 + 1,__buf,in_RCX);
  fmt::v10::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::~basic_memory_buffer(this_00);
  return;
}

Assistant:

SPDLOG_INLINE void basic_file_sink<Mutex>::sink_it_(const details::log_msg &msg) {
    memory_buf_t formatted;
    base_sink<Mutex>::formatter_->format(msg, formatted);
    file_helper_.write(formatted);
}